

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLcode multi_do(Curl_easy *data,_Bool *done)

{
  connectdata *conn;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  conn._4_4_ = CURLE_OK;
  if (data->conn->handler->do_it != (_func_CURLcode_Curl_easy_ptr__Bool_ptr *)0x0) {
    conn._4_4_ = (*data->conn->handler->do_it)(data,done);
  }
  return conn._4_4_;
}

Assistant:

static CURLcode multi_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;

  DEBUGASSERT(conn);
  DEBUGASSERT(conn->handler);

  if(conn->handler->do_it)
    result = conn->handler->do_it(data, done);

  return result;
}